

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vector.h
# Opt level: O3

void __thiscall sc_core::sc_vector_base::~sc_vector_base(sc_vector_base *this)

{
  vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *pvVar1;
  pointer ppsVar2;
  pointer ppsVar3;
  
  (this->super_sc_object)._vptr_sc_object = (_func_int **)&PTR_print_0026eee8;
  pvVar1 = this->objs_vec_;
  if ((pvVar1 != (vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *)0x0) &&
     (ppsVar2 = (pvVar1->
                super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>).
                _M_impl.super__Vector_impl_data._M_start, ppsVar2 != (pointer)0x0)) {
    operator_delete(ppsVar2);
  }
  operator_delete(pvVar1);
  ppsVar3 = (this->vec_).
            super__Vector_base<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppsVar3 != (pointer)0x0) {
    operator_delete(ppsVar3);
  }
  sc_object::~sc_object(&this->super_sc_object);
  return;
}

Assistant:

~sc_vector_base()
    { delete objs_vec_; }